

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

Vec4 __thiscall vkt::sr::QuadGrid::getUserAttrib(QuadGrid *this,int attribNdx,float sx,float sy)

{
  int in_EDX;
  undefined4 in_register_00000034;
  Vector<float,_4> VVar1;
  Vec4 VVar2;
  Vector<float,_4> local_18;
  
  local_18.m_data[2] = 0.0;
  local_18.m_data[3] = 1.0;
  local_18.m_data[0] = sx;
  local_18.m_data[1] = sy;
  VVar1 = tcu::operator*((tcu *)this,
                         (Matrix<float,_4,_4> *)
                         ((long)in_EDX * 0x40 +
                         *(long *)(CONCAT44(in_register_00000034,attribNdx) + 0x20)),&local_18);
  VVar2.m_data[0] = VVar1.m_data[0];
  VVar2.m_data[1] = VVar1.m_data[1];
  VVar2.m_data[2] = VVar1.m_data[2];
  VVar2.m_data[3] = VVar1.m_data[3];
  return (Vec4)VVar2.m_data;
}

Assistant:

inline tcu::Vec4 QuadGrid::getUserAttrib (int attribNdx, float sx, float sy) const
{
	// homogeneous normalized screen-space coordinates
	return m_userAttribTransforms[attribNdx] * tcu::Vec4(sx, sy, 0.0f, 1.0f);
}